

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O0

float trainCNN(vector<layer_t_*,_std::allocator<layer_t_*>_> *layers,
              vector<case_t,_std::allocator<case_t>_> *cases)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  float xerr;
  case_t *c;
  iterator __end1;
  iterator __begin1;
  vector<case_t,_std::allocator<case_t>_> *__range1;
  int count;
  float total_error;
  tensor_t<float> *in_stack_00000050;
  tensor_t<float> *in_stack_00000058;
  vector<layer_t_*,_std::allocator<layer_t_*>_> *in_stack_00000060;
  ostream *in_stack_ffffffffffffffb8;
  _Setw in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  __normal_iterator<case_t_*,_std::vector<case_t,_std::allocator<case_t>_>_> local_28 [2];
  int local_18;
  float local_14;
  
  local_14 = 0.0;
  local_18 = 0;
  local_28[0]._M_current =
       (case_t *)
       std::vector<case_t,_std::allocator<case_t>_>::begin
                 ((vector<case_t,_std::allocator<case_t>_> *)in_stack_ffffffffffffffb8);
  std::vector<case_t,_std::allocator<case_t>_>::end
            ((vector<case_t,_std::allocator<case_t>_> *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<case_t_*,_std::vector<case_t,_std::allocator<case_t>_>_> *
                       )CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0._M_n),
                       (__normal_iterator<case_t_*,_std::vector<case_t,_std::allocator<case_t>_>_> *
                       )in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<case_t_*,_std::vector<case_t,_std::allocator<case_t>_>_>::operator*
              (local_28);
    in_stack_ffffffffffffffc4 = trainIterate(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    local_14 = in_stack_ffffffffffffffc4 + local_14;
    local_18 = local_18 + 1;
    if (local_18 % 6000 == 0) {
      in_stack_ffffffffffffffb8 = std::operator<<((ostream *)&std::cout,"Case ");
      in_stack_ffffffffffffffc0 = std::setw(5);
      poVar2 = std::operator<<(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
      poVar2 = std::operator<<(poVar2,". Err=");
      this = (void *)std::ostream::operator<<(poVar2,local_14 / (float)local_18);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::__normal_iterator<case_t_*,_std::vector<case_t,_std::allocator<case_t>_>_>::
    operator++(local_28);
  }
  return local_14;
}

Assistant:

float trainCNN(std::vector<layer_t *> &layers, std::vector<case_t> &cases) {
  float total_error = 0.0f;
  // Iterate over all the test cases
  int count = 0;
  for (case_t &c : cases) {
    // Train the model with a new test case, and retreive the new error.
    float xerr = trainIterate(layers, c.data, c.out);
    // Accumulate the total error for all test cases.
    total_error += xerr;

    // Once every 6000 training iterations, report the total error.
    count++;
    if (count % 6000 == 0) {
      std::cout << "Case " << std::setw(5) << count << ". Err=" << total_error / count << std::endl;
    }
  }
  return total_error;
}